

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

void internal_invokegen_ok(Am_Object *valinvokegen_window)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Value_List *this;
  ostream *poVar4;
  void *pvVar5;
  Am_Wrapper *pAVar6;
  Am_Slot_Key AVar7;
  undefined1 local_368 [8];
  Am_Value new_value;
  Am_Object local_350;
  Am_Object new_ph;
  ostrstream local_340 [8];
  ostrstream oss;
  char local_1d8 [8];
  char line [250];
  Am_Object local_d0;
  Am_Object local_c8;
  int local_bc;
  undefined1 local_b8 [4];
  int placeholder_cnt;
  Am_Value_List placeholder_list;
  undefined1 local_a0 [8];
  Am_Value old_val;
  Am_Object create_cmd;
  Am_Object script_line;
  Am_Object proto;
  Am_Value_List part_chain;
  int how_gen;
  Am_Object execute_command;
  undefined1 local_48 [6];
  Am_Slot_Key slot;
  Am_Value_List sel_list;
  Am_Object script_window;
  Am_Object local_20;
  Am_Object invoke_window;
  Am_Object match_command;
  Am_Object *valinvokegen_window_local;
  
  pAVar3 = Am_Object::Get(valinvokegen_window,Am_INVOKE_MATCH_COMMAND,0);
  Am_Object::Am_Object(&invoke_window,pAVar3);
  pAVar3 = Am_Object::Get(valinvokegen_window,Am_SCRIPT_WINDOW,0);
  Am_Object::Am_Object(&local_20,pAVar3);
  pAVar3 = Am_Object::Get(&local_20,Am_SCRIPT_WINDOW,0);
  Am_Object::Am_Object((Am_Object *)&sel_list.item,pAVar3);
  pAVar3 = Am_Object::Get(valinvokegen_window,0xc5,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_48,pAVar3);
  pAVar3 = Am_Object::Get(valinvokegen_window,0xb8,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  execute_command.data._6_2_ = (Am_Slot_Key)iVar2;
  pAVar3 = Am_Object::Get((Am_Object *)&sel_list.item,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffa8,pAVar3);
  AVar7 = (Am_Slot_Key)valinvokegen_window;
  Am_Object::Get_Object((Am_Object *)&part_chain.item,AVar7,(ulong)Am_UNDO_OPTIONS);
  pAVar3 = Am_Object::Get((Am_Object *)&part_chain.item,0x169,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object((Am_Object *)&part_chain.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&proto);
  Am_Object::Am_Object(&script_line);
  pAVar3 = Am_Value_List::Get_First((Am_Value_List *)local_48);
  Am_Object::Am_Object(&create_cmd,pAVar3);
  pAVar3 = Am_Object::Get(&create_cmd,0xc5,0);
  Am_Object::Am_Object((Am_Object *)&old_val.value,pAVar3);
  Am_Object::Get_Object((Am_Object *)&placeholder_list.item,AVar7,(ulong)Am_CONSTANT_OBJECTS_WIDGET)
  ;
  pAVar3 = Am_Object::Get((Am_Object *)&placeholder_list.item,0xfa,0);
  Am_Value::Am_Value((Am_Value *)local_a0,pAVar3);
  Am_Object::~Am_Object((Am_Object *)&placeholder_list.item);
  pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffa8,Am_PLACEHOLDER_LIST,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_b8,pAVar3);
  pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffa8,Am_PLACEHOLDER_COUNT,0);
  local_bc = Am_Value::operator_cast_to_int(pAVar3);
  switch(iVar2) {
  case 1:
    Am_Object::operator=(&script_line,&Am_Constant_Placeholder);
    break;
  default:
    poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar4 = std::operator<<(poVar4,"Bad type ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar2);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    Am_Error();
  case 4:
    Am_Object::Get_Object((Am_Object *)(line + 0xf8),AVar7,(ulong)Am_ALL_FROM_COMMAND_WIDGET);
    pAVar3 = Am_Object::Get((Am_Object *)(line + 0xf8),0xfa,3);
    Am_Object::operator=((Am_Object *)&old_val.value,pAVar3);
    Am_Object::~Am_Object((Am_Object *)(line + 0xf8));
    bVar1 = Am_Object::Valid((Am_Object *)&old_val.value);
    if (!bVar1) {
      std::ostrstream::ostrstream(local_340,local_1d8,0xfa,_S_out);
      poVar4 = std::operator<<((ostream *)local_340,"Command not filled in.");
      std::ostream::operator<<(poVar4,std::ends<char,std::char_traits<char>>);
      Am_Pop_Up_Error_Window(local_1d8);
      std::ostrstream::~ostrstream(local_340);
      new_ph.data._4_4_ = 1;
      goto LAB_002b18c0;
    }
    Am_Object::operator=(&script_line,&Am_All_Values_From_Command_Placeholder);
    break;
  case 6:
    Am_Error("Custom not yet implemented");
  case 0x1f:
    Am_Object::Get_Object(&local_c8,AVar7,(ulong)Am_TYPE_OBJECTS_WIDGET);
    pAVar3 = Am_Object::Get(&local_c8,0x169,0);
    this = Am_Value_List::Add((Am_Value_List *)&proto,pAVar3,Am_TAIL,true);
    Am_Object::Get_Object(&local_d0,AVar7,(ulong)Am_TYPE_OBJECTS_WIDGET);
    pAVar3 = Am_Object::Get(&local_d0,0xfa,0);
    Am_Value_List::Add(this,pAVar3,Am_TAIL,true);
    Am_Object::~Am_Object(&local_d0);
    Am_Object::~Am_Object(&local_c8);
    Am_Object::operator=(&script_line,&Am_Type_Match_Placeholder);
    break;
  case 0x20:
    gen_any_value_header((Am_Value *)local_a0,(Am_Value_List *)&proto,execute_command.data._6_2_);
    Am_Object::operator=(&script_line,&Am_Any_Value_Placeholder);
  }
  Am_Object::Am_Object((Am_Object *)&new_value.value,&script_line);
  am_call_create_placeholder
            (&local_350,(Am_Value *)&new_value.value,(Am_Object *)local_a0,
             (Am_Value_List *)&old_val.value,(Am_Value_List *)local_b8,(int *)&proto,
             (Am_Slot_Key)&local_bc);
  Am_Object::~Am_Object((Am_Object *)&new_value.value);
  AVar7 = Am_LOCATION_PLACEHOLDER;
  pAVar3 = Am_Object::Get(valinvokegen_window,Am_LOCATION_PLACEHOLDER,3);
  Am_Object::Set(&local_350,AVar7,pAVar3,1);
  if ((am_sdebug & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"valinvokegen: New placeholder is ");
    poVar4 = operator<<(poVar4,&local_350);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  }
  AVar7 = Am_PLACEHOLDER_LIST;
  pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_b8);
  Am_Object::Set((Am_Object *)&stack0xffffffffffffffa8,AVar7,pAVar6,0);
  Am_Object::Set((Am_Object *)&stack0xffffffffffffffa8,Am_PLACEHOLDER_COUNT,local_bc,0);
  Am_Value::Am_Value((Am_Value *)local_368);
  pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_350);
  Am_Value::operator=((Am_Value *)local_368,pAVar6);
  am_script_replace_all
            ((Am_Value_List *)local_48,(Am_Value *)local_368,&local_20,execute_command.data._6_2_,
             &invoke_window);
  Am_Value::~Am_Value((Am_Value *)local_368);
  Am_Object::~Am_Object(&local_350);
  new_ph.data._4_4_ = 0;
LAB_002b18c0:
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_b8);
  Am_Value::~Am_Value((Am_Value *)local_a0);
  Am_Object::~Am_Object((Am_Object *)&old_val.value);
  Am_Object::~Am_Object(&create_cmd);
  Am_Object::~Am_Object(&script_line);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&proto);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffa8);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  Am_Object::~Am_Object((Am_Object *)&sel_list.item);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&invoke_window);
  return;
}

Assistant:

void
internal_invokegen_ok(Am_Object &valinvokegen_window)
{
  Am_Object match_command = valinvokegen_window.Get(Am_INVOKE_MATCH_COMMAND);
  Am_Object invoke_window = valinvokegen_window.Get(Am_SCRIPT_WINDOW);
  Am_Object script_window = invoke_window.Get(Am_SCRIPT_WINDOW);
  Am_Value_List sel_list = valinvokegen_window.Get(Am_COMMAND);
  Am_Slot_Key slot =
      (Am_Slot_Key)(int)valinvokegen_window.Get(Am_SLOTS_TO_SAVE);
  Am_Object execute_command = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  int how_gen = valinvokegen_window.Get_Object(Am_UNDO_OPTIONS).Get(Am_VALUE);
  Am_Value_List part_chain;
  Am_Object proto;
  Am_Object script_line = sel_list.Get_First();
  Am_Object create_cmd = script_line.Get(Am_COMMAND);
  Am_Value old_val =
      valinvokegen_window.Get_Object(Am_CONSTANT_OBJECTS_WIDGET).Get(Am_VALUES);

  Am_Value_List placeholder_list = execute_command.Get(Am_PLACEHOLDER_LIST);
  int placeholder_cnt = execute_command.Get(Am_PLACEHOLDER_COUNT);
  switch (how_gen) {
  case am_constant_generalize:
    proto = Am_Constant_Placeholder;
    break;
  case am_type_generalize:
    part_chain
        .Add(valinvokegen_window.Get_Object(Am_TYPE_OBJECTS_WIDGET)
                 .Get(Am_VALUE))
        .Add(valinvokegen_window.Get_Object(Am_TYPE_OBJECTS_WIDGET)
                 .Get(Am_VALUES));
    proto = Am_Type_Match_Placeholder;
    break;
  case am_any_value_generalize:
    gen_any_value_header(old_val, part_chain, slot);
    proto = Am_Any_Value_Placeholder;
    break;
  case am_all_values_generalize:
    create_cmd = valinvokegen_window.Get_Object(Am_ALL_FROM_COMMAND_WIDGET)
                     .Get(Am_VALUES, Am_RETURN_ZERO_ON_ERROR);
    if (!create_cmd.Valid()) {
      AM_POP_UP_ERROR_WINDOW("Command not filled in.");
      return; //don't finish with this window
    }
    proto = Am_All_Values_From_Command_Placeholder;
    break;
  case am_custom_generalize: {
    Am_Error("Custom not yet implemented");
    break;
  }
  default:
    Am_ERROR("Bad type " << how_gen);
  } //end switch

  Am_Object new_ph =
      am_call_create_placeholder(proto, old_val, create_cmd, placeholder_list,
                                 part_chain, placeholder_cnt, slot);
  //needed if placeholder for location
  new_ph.Set(
      Am_LOCATION_PLACEHOLDER,
      valinvokegen_window.Get(Am_LOCATION_PLACEHOLDER, Am_RETURN_ZERO_ON_ERROR),
      Am_OK_IF_NOT_THERE);
  if (am_sdebug)
    std::cout << "valinvokegen: New placeholder is " << new_ph << std::endl
              << std::flush;
  execute_command.Set(Am_PLACEHOLDER_LIST, placeholder_list);
  execute_command.Set(Am_PLACEHOLDER_COUNT, placeholder_cnt);
  Am_Value new_value;
  new_value = new_ph;
  am_script_replace_all(sel_list, new_value, invoke_window, slot,
                        match_command);
}